

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  code *pcVar5;
  code *pcVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  
  lVar4 = dlopen("./counter.so",0x101);
  if (lVar4 != 0) {
    pcVar5 = (code *)dlsym(lVar4,"count");
    if (pcVar5 != (code *)0x0) {
      uVar8 = 0;
      bVar2 = 0;
      do {
        bVar1 = bVar2;
        pcVar6 = pcVar5;
        if ((uVar8 & 1) == 0) {
          pcVar6 = my_count;
        }
        uVar3 = (*pcVar6)();
        bVar9 = uVar8 != uVar3;
        printf("%d\n",(ulong)uVar3);
        uVar8 = uVar8 + 1;
        bVar2 = bVar1 | bVar9;
      } while (uVar8 != 10);
      iVar7 = 0xfa;
      if (!(bool)(bVar1 | bVar9)) {
        iVar7 = 0;
      }
      goto LAB_0010127b;
    }
  }
  main_cold_1();
  iVar7 = 0xfb;
LAB_0010127b:
  if (lVar4 != 0) {
    dlclose(lVar4);
  }
  return iVar7;
}

Assistant:

int main(int argc, char **argv) {
    void *counter_module;
    int (*count)(void);
    int i, n;
    int result;

    counter_module = dlopen("./counter.so", RTLD_LAZY | RTLD_GLOBAL);
    if(!counter_module) goto error;

    count = dlsym(counter_module, "count");
    if(!count) goto error;

    result = 0;
    for(i=0; i<10; ++i) {
        n = ((i%2) ? count : my_count)();
        result = (result || n != i) ? 250 : 0;
        printf("%d\n", n);
    }

    goto done;
    error:
        fprintf(stderr, "Error occured:\n    %s\n", dlerror());
        result = 251;

    done:
        if(counter_module) dlclose(counter_module);
        return result;
}